

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O0

DebugClient * __thiscall
PoolList<ProxyServer::DebugClient>::append<ProxyServer::DebugListener&,Server::Client&>
          (PoolList<ProxyServer::DebugClient> *this,DebugListener *a,Client *b)

{
  DebugClient *pDVar1;
  Client *b_local;
  DebugListener *a_local;
  PoolList<ProxyServer::DebugClient> *this_local;
  
  pDVar1 = allocateFreeItem(this);
  ProxyServer::DebugClient::DebugClient(pDVar1,a,b);
  pDVar1 = linkFreeItem(this,pDVar1);
  return pDVar1;
}

Assistant:

T& append(A a, B b) {return linkFreeItem(new (allocateFreeItem()) T(a, b));}